

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mt.c
# Opt level: O1

uint32_t sylvan_mt_create_type(void)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = cl_registry_count;
  if (cl_registry_count == cl_registry_size) {
    sVar2 = cl_registry_size + 8;
    cl_registry_size = sVar2;
    cl_registry = (customleaf_t *)realloc(cl_registry,sVar2 * 0x38);
    memset(cl_registry + sVar1,0,(sVar2 - sVar1) * 0x38);
  }
  cl_registry_count = sVar1 + 1;
  return (uint32_t)sVar1;
}

Assistant:

uint32_t
sylvan_mt_create_type()
{
    if (cl_registry_count == cl_registry_size) {
        // resize registry array
        cl_registry_size += 8;
        cl_registry = (customleaf_t *)realloc(cl_registry, sizeof(customleaf_t) * (cl_registry_size));
        memset(cl_registry + cl_registry_count, 0, sizeof(customleaf_t) * (cl_registry_size-cl_registry_count));
    }
    return cl_registry_count++;
}